

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O1

GeoParquetFileMetadata * __thiscall duckdb::ParquetWriter::GetGeoParquetData(ParquetWriter *this)

{
  _Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false> __s;
  type pGVar1;
  
  if ((this->geoparquet_data).
      super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
      .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl ==
      (GeoParquetFileMetadata *)0x0) {
    __s._M_head_impl = (GeoParquetFileMetadata *)operator_new(0xa0);
    switchD_01306cb1::default(__s._M_head_impl,0,0xa0);
    ((__s._M_head_impl)->version)._M_dataplus = (pointer)((long)&(__s._M_head_impl)->version + 0x10)
    ;
    *(undefined4 *)((long)&(__s._M_head_impl)->version + 0x10) = 0x2e312e31;
    *(undefined2 *)((long)&(__s._M_head_impl)->version + 0x14) = 0x30;
    *(size_type *)((long)&(__s._M_head_impl)->version + 8) = 5;
    ((__s._M_head_impl)->primary_geometry_column)._M_dataplus =
         (pointer)((long)&(__s._M_head_impl)->primary_geometry_column + 0x10);
    *(size_type *)((long)&(__s._M_head_impl)->primary_geometry_column + 8) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(__s._M_head_impl)->primary_geometry_column + 0x10))->_M_local_buf[0] = '\0';
    ((__s._M_head_impl)->geometry_columns)._M_h._M_buckets =
         (__node_base_ptr *)((long)&(__s._M_head_impl)->geometry_columns + 0x30);
    *(size_type *)((long)&(__s._M_head_impl)->geometry_columns + 8) = 1;
    ((__node_base *)((long)&(__s._M_head_impl)->geometry_columns + 0x10))->_M_nxt =
         (_Hash_node_base *)0x0;
    *(size_type *)((long)&(__s._M_head_impl)->geometry_columns + 0x18) = 0;
    ((_Prime_rehash_policy *)((long)&(__s._M_head_impl)->geometry_columns + 0x20))->
    _M_max_load_factor = 1.0;
    *(size_t *)((long)&(__s._M_head_impl)->geometry_columns + 0x28) = 0;
    *(__node_base_ptr *)((long)&(__s._M_head_impl)->geometry_columns + 0x30) = (__node_base_ptr)0x0;
    (this->geoparquet_data).
    super_unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
    .super__Head_base<0UL,_duckdb::GeoParquetFileMetadata_*,_false>._M_head_impl = __s._M_head_impl;
  }
  pGVar1 = unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
           ::operator*(&this->geoparquet_data);
  return pGVar1;
}

Assistant:

GeoParquetFileMetadata &ParquetWriter::GetGeoParquetData() {
	if (!geoparquet_data) {
		geoparquet_data = make_uniq<GeoParquetFileMetadata>();
	}
	return *geoparquet_data;
}